

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O3

Var Js::RegexHelper::RegexEs6MatchImpl
              (ScriptContext *scriptContext,RecyclableObject *thisObj,JavascriptString *input,
              bool noResult,void *stackAllocationPointer)

{
  bool bVar1;
  BOOL BVar2;
  Var pvVar3;
  RecyclableObject *instance;
  JavascriptString *matchStr;
  JavascriptArray *arr;
  JavascriptArray *input_00;
  BigIndex local_48;
  JavascriptString *local_38;
  
  bVar1 = JavascriptRegExp::GetGlobalProperty(thisObj,scriptContext);
  if (bVar1) {
    JavascriptRegExp::GetUnicodeProperty(thisObj,scriptContext);
    JavascriptRegExp::SetLastIndexProperty(thisObj,&DAT_1000000000000,scriptContext);
    pvVar3 = JavascriptRegExp::CallExec
                       (thisObj,input,L"RegExp.prototype[Symbol.match]",scriptContext);
    BVar2 = JavascriptOperators::IsNull(pvVar3);
    if (BVar2 == 0) {
      arr = (JavascriptArray *)0x0;
      local_38 = input;
      do {
        instance = ExecResultToRecyclableObject(pvVar3);
        pvVar3 = JavascriptOperators::GetItem(instance,0,scriptContext);
        matchStr = JavascriptConversion::ToString(pvVar3,scriptContext);
        if (arr == (JavascriptArray *)0x0) {
          arr = JavascriptLibrary::CreateArray
                          ((scriptContext->super_ScriptContextBase).javascriptLibrary);
        }
        JavascriptArray::BigIndex::BigIndex(&local_48,(arr->super_ArrayObject).length);
        input_00 = arr;
        JavascriptArray::BigIndex::SetItem(&local_48,arr,matchStr);
        AdvanceLastIndex(thisObj,(JavascriptString *)input_00,matchStr,false,scriptContext);
        pvVar3 = JavascriptRegExp::CallExec
                           (thisObj,local_38,L"RegExp.prototype[Symbol.match]",scriptContext);
        BVar2 = JavascriptOperators::IsNull(pvVar3);
      } while (BVar2 == 0);
    }
    else {
      arr = (JavascriptArray *)
            (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
            super_JavascriptLibraryBase).nullValue.ptr;
    }
    return arr;
  }
  pvVar3 = JavascriptRegExp::CallExec(thisObj,input,L"RegExp.prototype[Symbol.match]",scriptContext)
  ;
  return pvVar3;
}

Assistant:

Var RegexHelper::RegexEs6MatchImpl(ScriptContext* scriptContext, RecyclableObject *thisObj, JavascriptString *input, bool noResult, void *const stackAllocationPointer)
    {
        PCWSTR const varName = _u("RegExp.prototype[Symbol.match]");

        if (!JavascriptRegExp::GetGlobalProperty(thisObj, scriptContext))
        {
            return JavascriptRegExp::CallExec(thisObj, input, varName, scriptContext);
        }
        else
        {
            bool unicode = JavascriptRegExp::GetUnicodeProperty(thisObj, scriptContext);

            JavascriptRegExp::SetLastIndexProperty(thisObj, TaggedInt::ToVarUnchecked(0), scriptContext);

            JavascriptArray* arrayResult = nullptr;

            do
            {
                Var result = JavascriptRegExp::CallExec(thisObj, input, varName, scriptContext);
                if (JavascriptOperators::IsNull(result))
                {
                    break;
                }

                RecyclableObject* resultObj = ExecResultToRecyclableObject(result);
                JavascriptString* matchStr = GetMatchStrFromResult(resultObj, scriptContext);

                if (arrayResult == nullptr)
                {
                    arrayResult = scriptContext->GetLibrary()->CreateArray();
                }

                arrayResult->DirectAppendItem(matchStr);

                AdvanceLastIndex(thisObj, input, matchStr, unicode, scriptContext);
            }
            while (true);

            return arrayResult != nullptr
                ? arrayResult
                : scriptContext->GetLibrary()->GetNull();
        }
    }